

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O0

void __thiscall cmFindCommon::SelectDefaultRootPathMode(cmFindCommon *this)

{
  cmAlphaNum *this_00;
  bool bVar1;
  string *psVar2;
  undefined1 local_b0 [8];
  string rootPathMode;
  cmAlphaNum local_60;
  undefined1 local_30 [8];
  string findRootPathVar;
  cmFindCommon *this_local;
  
  findRootPathVar.field_2._8_8_ = this;
  cmAlphaNum::cmAlphaNum(&local_60,"CMAKE_FIND_ROOT_PATH_MODE_");
  this_00 = (cmAlphaNum *)((long)&rootPathMode.field_2 + 8);
  cmAlphaNum::cmAlphaNum(this_00,&this->CMakePathName);
  cmStrCat<>((string *)local_30,&local_60,this_00);
  psVar2 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_30);
  std::__cxx11::string::string((string *)local_b0,(string *)psVar2);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b0,"NEVER");
  if (bVar1) {
    this->FindRootPathMode = RootPathModeNever;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,"ONLY");
    if (bVar1) {
      this->FindRootPathMode = RootPathModeOnly;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b0,"BOTH");
      if (bVar1) {
        this->FindRootPathMode = RootPathModeBoth;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmFindCommon::SelectDefaultRootPathMode()
{
  // Check the policy variable for this find command type.
  std::string findRootPathVar =
    cmStrCat("CMAKE_FIND_ROOT_PATH_MODE_", this->CMakePathName);
  std::string rootPathMode =
    this->Makefile->GetSafeDefinition(findRootPathVar);
  if (rootPathMode == "NEVER") {
    this->FindRootPathMode = RootPathModeNever;
  } else if (rootPathMode == "ONLY") {
    this->FindRootPathMode = RootPathModeOnly;
  } else if (rootPathMode == "BOTH") {
    this->FindRootPathMode = RootPathModeBoth;
  }
}